

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler_internal.h
# Opt level: O1

short * __thiscall
cubeb_resampler_speex_one_way<short>::output
          (cubeb_resampler_speex_one_way<short> *this,size_t output_frame_count,
          size_t *input_frames_used)

{
  size_t *psVar1;
  uint uVar2;
  short *psVar3;
  cubeb_log_level cVar4;
  uint uVar5;
  cubeb_log_callback p_Var6;
  ulong uVar7;
  ulong uVar8;
  uint32_t out_len;
  uint32_t in_len;
  uint local_30;
  uint local_2c;
  
  uVar7 = (this->super_processor).channels * output_frame_count;
  if ((this->resampling_out_buffer).capacity_ < uVar7) {
    auto_array<short>::reserve(&this->resampling_out_buffer,uVar7);
  }
  local_2c = (uint)((this->resampling_in_buffer).length_ / (ulong)(this->super_processor).channels);
  local_30 = (uint)output_frame_count;
  speex_resampler_process_interleaved_int
            (this->speex_resampler,(this->resampling_in_buffer).data_,&local_2c,
             (this->resampling_out_buffer).data_,&local_30);
  if (local_30 < output_frame_count) {
    cVar4 = cubeb_log_get_level();
    if (1 < (int)cVar4) {
      p_Var6 = cubeb_log_get_callback();
      if (p_Var6 != (cubeb_log_callback)0x0) {
        cubeb_log_internal("cubeb_resampler_internal.h",0x113,
                           "underrun during resampling: got %u frames, expected %zu",(ulong)local_30
                           ,output_frame_count);
      }
    }
    uVar2 = (this->super_processor).channels;
    uVar5 = local_30 * uVar2;
    uVar7 = (ulong)uVar5;
    uVar8 = output_frame_count * uVar2;
    if (uVar7 <= uVar8 && uVar8 - uVar7 != 0) {
      psVar3 = (this->resampling_out_buffer).data_;
      do {
        uVar5 = uVar5 + 1;
        psVar3[uVar7] = 0;
        uVar7 = (ulong)uVar5;
      } while (uVar7 <= uVar8 && uVar8 - uVar7 != 0);
    }
  }
  uVar8 = (ulong)(this->super_processor).channels * (ulong)local_2c;
  uVar7 = (this->resampling_in_buffer).length_;
  if ((uVar8 <= uVar7) && (psVar3 = (this->resampling_in_buffer).data_, psVar3 != (short *)0x0)) {
    memmove(psVar3,psVar3 + uVar8,(uVar7 - uVar8) * 2);
    psVar1 = &(this->resampling_in_buffer).length_;
    *psVar1 = *psVar1 - uVar8;
  }
  *input_frames_used = (ulong)local_2c;
  return (this->resampling_out_buffer).data_;
}

Assistant:

T * output(size_t output_frame_count, size_t * input_frames_used)
  {
    if (resampling_out_buffer.capacity() <
        frames_to_samples(output_frame_count)) {
      resampling_out_buffer.reserve(frames_to_samples(output_frame_count));
    }

    uint32_t in_len = samples_to_frames(resampling_in_buffer.length());
    uint32_t out_len = output_frame_count;

    speex_resample(resampling_in_buffer.data(), &in_len,
                   resampling_out_buffer.data(), &out_len);

    if (out_len < output_frame_count) {
      LOGV("underrun during resampling: got %u frames, expected %zu",
           (unsigned)out_len, output_frame_count);
      // silence the rightmost part
      T * data = resampling_out_buffer.data();
      for (uint32_t i = frames_to_samples(out_len);
           i < frames_to_samples(output_frame_count); i++) {
        data[i] = 0;
      }
    }

    /* This shifts back any unresampled samples to the beginning of the input
       buffer. */
    resampling_in_buffer.pop(nullptr, frames_to_samples(in_len));
    *input_frames_used = in_len;

    return resampling_out_buffer.data();
  }